

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

shared_ptr<Expr> __thiscall Parser::factor(Parser *this)

{
  shared_ptr<Token> *__args_1;
  int iVar1;
  element_type *peVar2;
  element_type *w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  shared_ptr<Expr> sVar4;
  shared_ptr<Expr> x;
  shared_ptr<Id> id;
  string s;
  Parser local_b8;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  x.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  x.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = peVar2->tag;
  if (iVar1 == 0x112) {
    std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)&x,
               &Constant::True.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>);
    move(in_RSI);
  }
  else if (iVar1 == 0x106) {
    std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)&x,
               &Constant::False.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>);
    move(in_RSI);
  }
  else {
    __args_1 = &in_RSI->look;
    if (iVar1 == 0x108) {
      (**peVar2->_vptr_Token)(&s);
      w = (in_RSI->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,&__args_1->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>);
      Env::get((Env *)&id,(shared_ptr<Token> *)w);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      if (id.super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
        (**((__args_1->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Token)
                  (&local_b8);
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8," undeclared");
        error(in_RSI,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      move(in_RSI);
      _Var3 = id.super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      if (((__args_1->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tag == 0x5b) {
        std::__shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2> *)&local_b8.look,
                   &id.super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>);
        offset(&local_b8,(shared_ptr<Id> *)in_RSI);
        _Var3._M_pi = local_b8.top.super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
        local_b8.top.super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_b8.top.super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var3._M_pi;
        local_b8.top.super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_b8.top.super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_b8.look.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      else {
        id.super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)id.super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var3._M_pi;
        id.super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&id.super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&s);
      goto LAB_0010c913;
    }
    if (iVar1 == 0x10e) {
      std::make_shared<Constant,std::shared_ptr<Token>&,std::shared_ptr<Type>&>
                ((shared_ptr<Token> *)&s,(shared_ptr<Type> *)__args_1);
      std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)&x,
                 (__shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2> *)&s);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_string_length);
      move(in_RSI);
    }
    else if (iVar1 == 0x110) {
      std::make_shared<Constant,std::shared_ptr<Token>&,std::shared_ptr<Type>&>
                ((shared_ptr<Token> *)&s,(shared_ptr<Type> *)__args_1);
      std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)&x,
                 (__shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2> *)&s);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_string_length);
      move(in_RSI);
    }
    else {
      if (iVar1 != 0x28) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"syntax error",(allocator<char> *)&s);
        error(in_RSI,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
        ;
        (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0010c913;
      }
      move(in_RSI);
      boolean((Parser *)&s);
      std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&x.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2> *)&s);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s._M_string_length);
      match(in_RSI,0x29);
    }
  }
  _Var3._M_pi = x.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  x.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)x.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  x.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_0010c913:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&x.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> factor() {
		std::shared_ptr<Expr> x;
		switch (look->tag) {
		case '(':
			move(); x = boolean(); match(')');
			return x;
			break;
		case NUM:
			x = std::make_shared<Constant>(look, Type::Int);
			move(); return x;
			break;
		case REAL:
			x = std::make_shared<Constant>(look, Type::Float);
			move(); return x;
			break;
		case TRUE:
			x = Constant::True;
			move(); return x;
			break;
		case FALSE:
			x = Constant::False;
			move(); return x;
			break;
		case ID:
			{
				std::string s = look->toString();
				std::shared_ptr<Id> id = top->get(look);
				if (id == nullptr) {
					error(look->toString() + " undeclared");
				}
				move();
				if (look->tag != '[') return id;
				else return offset(id);
			}
			break;
		default:
			error("syntax error");
			return nullptr;
			break;
		}
		
		return nullptr;
	}